

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotScatter<int>(char *label_id,int *xs,int *ys,int count,int offset,int stride)

{
  undefined1 local_50 [8];
  GetterXsYs<int> getter;
  int stride_local;
  int offset_local;
  int count_local;
  int *ys_local;
  int *xs_local;
  char *label_id_local;
  
  getter._28_4_ = stride;
  GetterXsYs<int>::GetterXsYs((GetterXsYs<int> *)local_50,xs,ys,count,offset,stride);
  PlotScatterEx<ImPlot::GetterXsYs<int>>(label_id,(GetterXsYs<int> *)local_50);
  return;
}

Assistant:

void PlotScatter(const char* label_id, const T* xs, const T* ys, int count, int offset, int stride) {
    GetterXsYs<T> getter(xs,ys,count,offset,stride);
    return PlotScatterEx(label_id, getter);
}